

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::ShardedLRUCache(ShardedLRUCache *this,size_t capacity)

{
  LRUCache *local_40;
  int local_34;
  int s;
  size_t per_shard;
  size_t capacity_local;
  ShardedLRUCache *this_local;
  
  Cache::Cache(&this->super_Cache);
  (this->super_Cache)._vptr_Cache = (_func_int **)&PTR__ShardedLRUCache_0016c630;
  local_40 = this->shard_;
  do {
    LRUCache::LRUCache(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (LRUCache *)&this->id_mutex_);
  port::Mutex::Mutex(&this->id_mutex_);
  this->last_id_ = 0;
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
    LRUCache::SetCapacity(this->shard_ + local_34,capacity + 0xf >> 4);
  }
  return;
}

Assistant:

explicit ShardedLRUCache(size_t capacity) : last_id_(0) {
    const size_t per_shard = (capacity + (kNumShards - 1)) / kNumShards;
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].SetCapacity(per_shard);
    }
  }